

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar5;
  Vec_Int_t *__ptr_00;
  int *pDesign;
  byte *__ptr_01;
  int *__ptr_02;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  Ndr_Data_t *p;
  Vec_Int_t *p_00;
  int Output;
  int in_stack_ffffffffffffff88;
  int local_74;
  Vec_Int_t *pInputs;
  Vec_Int_t *pVVar16;
  Vec_Int_t *p_01;
  int local_34;
  
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 100;
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar4->pArray = piVar3;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  piVar3 = (int *)malloc(400);
  __ptr->pArray = piVar3;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar5->pArray = piVar3;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 100;
  __ptr_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  __ptr_00->pArray = piVar3;
  uVar1 = vBuffer->nSize;
  if ((int)uVar1 < 1) {
LAB_0036d359:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (*vBuffer->pArray != 1) {
    __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0xda,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
  }
  pInputs = pVVar4;
  pVVar16 = pVVar2;
  if (2 < uVar1) {
    uVar10 = 2;
    p_00 = (Vec_Int_t *)0x0;
    p_01 = pVVar5;
    do {
      uVar8 = (uint)uVar10;
      iVar7 = vBuffer->pArray[uVar10];
      uVar9 = uVar8;
      pVVar5 = p_01;
      if ((p_00 == (Vec_Int_t *)0x0) && (0xd < iVar7)) {
        p_00 = (Vec_Int_t *)0x0;
      }
      else {
        switch(iVar7) {
        case 2:
          goto switchD_0036cd4e_caseD_2;
        case 3:
          p_00 = pVVar2;
          break;
        case 4:
          p_00 = pVVar4;
          break;
        case 5:
          p_00 = __ptr;
          break;
        default:
          if (iVar7 - 6U < 8) {
            uVar14 = uVar8 + 1;
            if ((int)uVar1 <= (int)uVar14) goto LAB_0036d359;
            pcVar6 = Abc_NamStr(pNames,vBuffer->pArray[uVar14]);
            p_00 = __ptr_00;
            pVVar5 = p_01;
            Vec_IntPush(p_01,iVar7);
            pVVar4 = pInputs;
            __ptr_00 = p_00;
            pVVar2 = pVVar16;
            Vec_IntPush(p_01,p_00->nSize);
            pInputs = pVVar4;
            pVVar16 = pVVar2;
            if ((((pcVar6[1] == 'z') && (p_00 = __ptr_00, pcVar6[2] == '_')) && (pcVar6[3] == 'g'))
               && (uVar9 = uVar14, pcVar6[4] != '_')) {
              uVar9 = uVar8;
            }
          }
          else {
            Vec_IntPush(p_00,iVar7);
            pVVar5 = p_01;
          }
        }
      }
      uVar10 = (ulong)(uVar9 + 1);
      uVar1 = vBuffer->nSize;
      p_01 = pVVar5;
    } while ((int)(uVar9 + 1) < (int)uVar1);
  }
switchD_0036cd4e_caseD_2:
  local_74 = iVar7;
  pVVar4 = pVVar5;
  Vec_IntPush(pVVar5,-1);
  Vec_IntPush(pVVar5,__ptr_00->nSize);
  if (vBuffer->nSize < 2) goto LAB_0036d359;
  piVar3 = vBuffer->pArray;
  iVar11 = piVar3[1];
  pDesign = (int *)malloc(0x18);
  pDesign[1] = 0x10;
  __ptr_01 = (byte *)malloc(0x10);
  *(byte **)(pDesign + 2) = __ptr_01;
  __ptr_02 = (int *)malloc(0x100);
  *(int **)(pDesign + 4) = __ptr_02;
  __ptr_01[0] = 1;
  __ptr_01[1] = 7;
  *pDesign = 2;
  __ptr_02[1] = iVar11;
  *__ptr_02 = 2;
  if (iVar11 == 0) {
    __assert_fail("Name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                  ,0x20d,"void *Ndr_Create(int)");
  }
  iVar11 = piVar3[1];
  __ptr_01[2] = 2;
  __ptr_01[3] = 7;
  lVar12 = 4;
  *pDesign = 4;
  __ptr_02[3] = iVar11;
  __ptr_02[2] = 2;
  *__ptr_02 = 4;
  uVar1 = pVVar16->nSize;
  if ((long)(int)uVar1 < 0xd) {
    uVar8 = 0x10;
    uVar9 = 0x10;
    if (0 < (int)uVar1) goto LAB_0036cf1b;
  }
  else {
    uVar8 = 0x1c;
    if (0x1c < uVar1) {
      uVar8 = uVar1;
    }
    uVar9 = uVar8 + 4;
    pDesign[1] = uVar9;
    __ptr_01 = (byte *)realloc(__ptr_01,(ulong)uVar9);
    *(byte **)(pDesign + 2) = __ptr_01;
    __ptr_02 = (int *)realloc(__ptr_02,(ulong)(uVar8 * 4 + 0x10));
    *(int **)(pDesign + 4) = __ptr_02;
LAB_0036cf1b:
    uVar8 = uVar9;
    piVar3 = pVVar16->pArray;
    lVar13 = 4;
    do {
      iVar7 = piVar3[lVar13 + -4];
      __ptr_01[lVar13] = 4;
      lVar12 = lVar13 + 1;
      __ptr_02[lVar13] = iVar7;
      uVar10 = lVar13 - 3;
      lVar13 = lVar12;
    } while (uVar10 < (ulong)(long)(int)uVar1);
    *pDesign = (int)lVar12;
  }
  iVar11 = (int)lVar12;
  local_74 = iVar7;
  if (__ptr_01[2] == 0) {
LAB_0036d3b6:
    __assert_fail("p->pHead[i]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                  ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
  }
  if (__ptr_01[2] < 4) {
    __ptr_02[2] = __ptr_02[2] + uVar1;
    if (*__ptr_01 == 0) goto LAB_0036d3b6;
    if (*__ptr_01 < 4) {
      *__ptr_02 = *__ptr_02 + uVar1;
      iVar15 = pInputs->nSize;
      uVar1 = iVar11 + iVar15;
      if ((int)uVar8 < (int)uVar1) {
        uVar9 = uVar8 * 2;
        if ((int)(uVar8 * 2) <= (int)uVar1) {
          uVar9 = uVar1;
        }
        pDesign[1] = uVar9;
        __ptr_01 = (byte *)realloc(__ptr_01,(ulong)uVar9);
        *(byte **)(pDesign + 2) = __ptr_01;
        __ptr_02 = (int *)realloc(__ptr_02,(ulong)(uVar9 << 2));
        *(int **)(pDesign + 4) = __ptr_02;
      }
      if (0 < iVar15) {
        lVar12 = 0;
        do {
          iVar7 = pInputs->pArray[lVar12];
          __ptr_01[lVar12 + iVar11] = 5;
          __ptr_02[iVar11 + lVar12] = iVar7;
          lVar12 = lVar12 + 1;
          iVar15 = pInputs->nSize;
        } while (lVar12 < iVar15);
        iVar11 = iVar11 + (int)lVar12;
        *pDesign = iVar11;
        __ptr_01 = *(byte **)(pDesign + 2);
      }
      local_74 = iVar7;
      if (__ptr_01[2] == 0) goto LAB_0036d3b6;
      if (__ptr_01[2] < 4) {
        piVar3 = *(int **)(pDesign + 4);
        piVar3[2] = piVar3[2] + iVar15;
        if (*__ptr_01 == 0) goto LAB_0036d3b6;
        if (*__ptr_01 < 4) {
          *piVar3 = *piVar3 + pInputs->nSize;
          iVar15 = __ptr->nSize;
          iVar11 = iVar11 + iVar15;
          if (pDesign[1] < iVar11) {
            iVar15 = pDesign[1] * 2;
            if (iVar15 <= iVar11) {
              iVar15 = iVar11;
            }
            pDesign[1] = iVar15;
            __ptr_01 = (byte *)realloc(__ptr_01,(long)iVar15);
            *(byte **)(pDesign + 2) = __ptr_01;
            piVar3 = (int *)realloc(piVar3,(long)(iVar15 << 2));
            *(int **)(pDesign + 4) = piVar3;
            iVar15 = __ptr->nSize;
          }
          if (iVar15 < 1) {
            iVar11 = 0;
          }
          else {
            lVar12 = 0;
            iVar11 = 0;
            do {
              iVar7 = __ptr->pArray[lVar12];
              pcVar6 = Abc_NamStr(pNames,iVar7);
              if ((*pcVar6 == 't') && (pcVar6[1] == '_')) {
                iVar15 = *pDesign;
                __ptr_01[iVar15] = 10;
                piVar3 = *(int **)(pDesign + 4);
                *pDesign = iVar15 + 1;
                piVar3[iVar15] = iVar7;
                iVar11 = iVar11 + 1;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < __ptr->nSize);
          }
          local_74 = iVar7;
          if (__ptr_01[2] == 0) goto LAB_0036d3b6;
          if (__ptr_01[2] < 4) {
            piVar3[2] = piVar3[2] + iVar11;
            if (*__ptr_01 == 0) goto LAB_0036d3b6;
            if (*__ptr_01 < 4) {
              *piVar3 = *piVar3 + iVar11;
              pVVar2 = __ptr_00;
              pVVar5 = pVVar16;
              if (0 < pVVar16->nSize) {
                lVar12 = 0;
                do {
                  local_74 = pVVar16->pArray[lVar12];
                  Ndr_AddObject(pDesign,0x102,3,0,0,(int)&local_74,in_stack_ffffffffffffff88,
                                (int)__ptr,&pInputs->nCap,(int)pVVar2,&pVVar5->nCap,(char *)pVVar4);
                  lVar12 = lVar12 + 1;
                } while (lVar12 < pVVar16->nSize);
              }
              local_74 = Abc_NamStrFind(pNames,"1\'b0");
              if (local_74 != 0) {
                Ndr_AddObject(pDesign,0x102,7,0,0,(int)&local_74,in_stack_ffffffffffffff88,
                              (int)__ptr,&pInputs->nCap,(int)pVVar2,&pVVar5->nCap,(char *)pVVar4);
              }
              local_74 = Abc_NamStrFind(pNames,"1\'b1");
              if (local_74 != 0) {
                Ndr_AddObject(pDesign,0x102,8,0,0,(int)&local_74,in_stack_ffffffffffffff88,
                              (int)__ptr,&pInputs->nCap,(int)pVVar2,&pVVar5->nCap,(char *)pVVar4);
              }
              iVar7 = pVVar4->nSize;
              if (1 < (long)iVar7) {
                piVar3 = pVVar4->pArray;
                uVar10 = 3;
                do {
                  iVar11 = piVar3[uVar10 - 3];
                  if (0 < iVar11) {
                    uVar1 = piVar3[uVar10 - 2];
                    if (((int)uVar1 < 0) || (__ptr_00->nSize <= (int)uVar1)) goto LAB_0036d359;
                    local_34 = __ptr_00->pArray[uVar1];
                    if ((ulong)(long)iVar7 <= uVar10) goto LAB_0036d359;
                    if ((uint)__ptr_00->nSize <= uVar1 + 1) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                    }
                    if (7 < iVar11 - 6U) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                                    ,0x54,"int Acb_Type2Oper(int)");
                    }
                    Ndr_AddObject(pDesign,0x102,iVar11 + 5,~uVar1 + piVar3[uVar10],
                                  (int)__ptr_00->pArray + (uVar1 + 1) * 4,(int)&local_34,
                                  in_stack_ffffffffffffff88,(int)__ptr,&pInputs->nCap,(int)pVVar2,
                                  &pVVar5->nCap,(char *)pVVar4);
                  }
                  iVar11 = (int)uVar10;
                  uVar10 = uVar10 + 2;
                } while (iVar11 < iVar7);
              }
              if (0 < pInputs->nSize) {
                lVar12 = 0;
                pVVar16 = pInputs;
                do {
                  local_74 = pInputs->pArray[lVar12];
                  Ndr_AddObject(pDesign,0x102,4,1,(int)&local_74,(int)&local_74,
                                in_stack_ffffffffffffff88,(int)__ptr,&pVVar16->nCap,(int)pVVar2,
                                &pVVar5->nCap,(char *)pVVar4);
                  lVar12 = lVar12 + 1;
                } while (lVar12 < pInputs->nSize);
              }
              if (pVVar5->pArray != (int *)0x0) {
                free(pVVar5->pArray);
              }
              free(pVVar5);
              if (pInputs->pArray != (int *)0x0) {
                free(pInputs->pArray);
              }
              free(pInputs);
              if (__ptr->pArray != (int *)0x0) {
                free(__ptr->pArray);
              }
              free(__ptr);
              if (pVVar4->pArray != (int *)0x0) {
                free(pVVar4->pArray);
              }
              free(pVVar4);
              if (__ptr_00->pArray != (int *)0x0) {
                free(__ptr_00->pArray);
              }
              free(__ptr_00);
              return pDesign;
            }
          }
        }
      }
    }
  }
  __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
                i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}